

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::PDU::LE_Detonation_PDU::operator==(LE_Detonation_PDU *this,LE_Detonation_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if ((((((!KVar1) &&
         ((this->m_DetonationFlag1Union).m_ui8Flag == (Value->m_DetonationFlag1Union).m_ui8Flag)) &&
        ((this->m_DetonationFlag2Union).m_ui8Flag == (Value->m_DetonationFlag2Union).m_ui8Flag)) &&
       ((KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_TargetID,&Value->m_TargetID),
        !KVar1 && (KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=
                                     (&this->m_MunitionID,&Value->m_MunitionID), !KVar1)))) &&
      ((KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID),
       !KVar1 && ((KVar1 = DATA_TYPE::
                           LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::
                           operator!=(&this->m_LocEntCoord,&Value->m_LocEntCoord), !KVar1 &&
                  (KVar1 = DATA_TYPE::RelativeWorldCoordinates::operator!=
                                     (&this->m_LocWrldCoord,&Value->m_LocWrldCoord), !KVar1)))))) &&
     ((KVar1 = DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::
               operator!=(&this->m_Vel,&Value->m_Vel), !KVar1 &&
      ((KVar1 = DATA_TYPE::MunitionDescriptor::operator!=
                          (&this->m_MunitionDesc,&Value->m_MunitionDesc), !KVar1 &&
       (KVar1 = DATA_TYPE::LE_EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1)))))) {
    return this->m_ui8DetonationResult == Value->m_ui8DetonationResult;
  }
  return false;
}

Assistant:

KBOOL LE_Detonation_PDU::operator == ( const LE_Detonation_PDU & Value ) const
{
    if( LE_Header::operator              != ( Value ) )                              return false;
    if( m_DetonationFlag1Union.m_ui8Flag != Value.m_DetonationFlag1Union.m_ui8Flag ) return false;
    if( m_DetonationFlag2Union.m_ui8Flag != Value.m_DetonationFlag2Union.m_ui8Flag ) return false;
    if( m_TargetID                       != Value.m_TargetID )                       return false;
    if( m_MunitionID                     != Value.m_MunitionID )                     return false;
    if( m_EventID                        != Value.m_EventID )                        return false;
    if( m_LocEntCoord                    != Value.m_LocEntCoord )                    return false;
    if( m_LocWrldCoord                   != Value.m_LocWrldCoord )                   return false;
    if( m_Vel                            != Value.m_Vel )                            return false;
    if( m_MunitionDesc                   != Value.m_MunitionDesc )                   return false;
    if( m_Ori                            != Value.m_Ori )                            return false;
    if( m_ui8DetonationResult            != Value.m_ui8DetonationResult )            return false;
    return true;
}